

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O2

int Map_MappingGetMaxLevel(Map_Man_t *pMan)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)pMan->nOutputs;
  if (pMan->nOutputs < 1) {
    uVar2 = uVar3;
  }
  uVar1 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar4 = *(uint *)(((ulong)pMan->pOutputs[uVar3] & 0xfffffffffffffffe) + 0x1c) >> 5 & 0xffff;
    if (uVar1 <= uVar4) {
      uVar1 = uVar4;
    }
  }
  return uVar1;
}

Assistant:

int Map_MappingGetMaxLevel( Map_Man_t * pMan )
{
    int nLevelMax, i;
    nLevelMax = 0;
    for ( i = 0; i < pMan->nOutputs; i++ )
        nLevelMax = ((unsigned)nLevelMax) > Map_Regular(pMan->pOutputs[i])->Level? 
                nLevelMax : Map_Regular(pMan->pOutputs[i])->Level;
    return nLevelMax;
}